

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtoa.c
# Opt level: O3

int quorem(Bigint *b,Bigint *S)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  int iVar5;
  long lVar6;
  long lVar7;
  ulong uVar8;
  int iVar9;
  uint uVar10;
  ulong uVar11;
  uint32 *puVar12;
  uint32 *puVar13;
  uint32 *puVar14;
  uint32 *puVar15;
  ulong uVar16;
  long lVar17;
  uint32 *puVar18;
  
  iVar1 = S->wds;
  lVar6 = (long)iVar1;
  iVar9 = b->wds;
  iVar5 = 0;
  if (iVar1 <= iVar9) {
    puVar12 = S->x;
    uVar11 = lVar6 - 1;
    puVar13 = S->x + lVar6 + -1;
    puVar14 = b->x;
    uVar4 = (ulong)b->x[lVar6 + -1] / (ulong)(*puVar13 + 1);
    iVar5 = (int)uVar4;
    if (*puVar13 + 1 <= b->x[lVar6 + -1]) {
      lVar7 = 0;
      uVar16 = 0;
      puVar15 = puVar12;
      puVar18 = puVar14;
      do {
        uVar10 = *puVar15;
        puVar15 = puVar15 + 1;
        uVar8 = uVar10 * uVar4 + uVar16;
        uVar16 = uVar8 >> 0x20;
        lVar17 = ((ulong)*puVar18 - (uVar8 & 0xffffffff)) + lVar7;
        lVar7 = lVar17 >> 0x20;
        *puVar18 = (uint)lVar17;
        puVar18 = puVar18 + 1;
      } while (puVar15 <= puVar13);
      if (b->x[lVar6 + -1] == 0) {
        if (2 < iVar1) {
          lVar6 = lVar6 * 4 + 0x14;
          do {
            if (*(int *)((long)b->x + lVar6 + -0x1c) != 0) break;
            uVar11 = (ulong)((int)uVar11 - 1);
            lVar6 = lVar6 + -4;
          } while (0x1c < lVar6);
        }
        iVar9 = (int)uVar11;
        b->wds = iVar9;
      }
      else {
        iVar9 = b->wds;
      }
    }
    uVar10 = (uint)uVar11;
    if (iVar9 == S->wds) {
      lVar6 = (long)iVar9 * 4 + 0x1c;
      do {
        uVar2 = *(uint *)((long)S->x + lVar6 + -0x20);
        uVar3 = *(uint *)((long)b->x + lVar6 + -0x20);
        if (uVar3 != uVar2) {
          if (uVar3 < uVar2) {
            return iVar5;
          }
          break;
        }
        lVar6 = lVar6 + -4;
      } while (0x1c < lVar6);
    }
    else if (iVar9 < S->wds) {
      return iVar5;
    }
    lVar6 = 0;
    do {
      uVar2 = *puVar12;
      puVar12 = puVar12 + 1;
      lVar7 = ((ulong)*puVar14 - (ulong)uVar2) + lVar6;
      lVar6 = lVar7 >> 0x20;
      *puVar14 = (uint)lVar7;
      puVar14 = puVar14 + 1;
    } while (puVar12 <= puVar13);
    iVar5 = iVar5 + 1;
    if (b->x[(int)uVar10] == 0) {
      if (1 < (int)uVar10) {
        lVar6 = (long)(int)uVar10 * 4 + 0x18;
        do {
          uVar10 = (uint)uVar11;
          if (*(int *)((long)b->x + lVar6 + -0x1c) != 0) break;
          uVar10 = uVar10 - 1;
          uVar11 = (ulong)uVar10;
          lVar6 = lVar6 + -4;
        } while (0x1c < lVar6);
      }
      b->wds = uVar10;
    }
  }
  return iVar5;
}

Assistant:

static int
quorem(Bigint *b, Bigint *S)
{
    int n;
    ULong *bx, *bxe, q, *sx, *sxe;
#ifdef ULLong
    ULLong borrow, carry, y, ys;
#else
    ULong borrow, carry, y, ys;
    ULong si, z, zs;
#endif

    n = S->wds;
#ifdef DEBUG
    /*debug*/ if (b->wds > n)
        /*debug*/       Bug("oversize b in quorem");
#endif
    if (b->wds < n)
        return 0;
    sx = S->x;
    sxe = sx + --n;
    bx = b->x;
    bxe = bx + n;
    q = *bxe / (*sxe + 1);      /* ensure q <= true quotient */
#ifdef DEBUG
    /*debug*/ if (q > 9)
        /*debug*/       Bug("oversized quotient in quorem");
#endif
    if (q) {
        borrow = 0;
        carry = 0;
        do {
#ifdef ULLong
            ys = *sx++ * (ULLong)q + carry;
            carry = ys >> 32;
            y = *bx - (ys & FFFFFFFF) - borrow;
            borrow = y >> 32 & (ULong)1;
            *bx++ = (ULong)(y & FFFFFFFF);
#else
            si = *sx++;
            ys = (si & 0xffff) * q + carry;
            zs = (si >> 16) * q + (ys >> 16);
            carry = zs >> 16;
            y = (*bx & 0xffff) - (ys & 0xffff) - borrow;
            borrow = (y & 0x10000) >> 16;
            z = (*bx >> 16) - (zs & 0xffff) - borrow;
            borrow = (z & 0x10000) >> 16;
            Storeinc(bx, z, y);
#endif
        }
        while(sx <= sxe);
        if (!*bxe) {
            bx = b->x;
            while(--bxe > bx && !*bxe)
                --n;
            b->wds = n;
        }
    }
    if (cmp(b, S) >= 0) {
        q++;
        borrow = 0;
        carry = 0;
        bx = b->x;
        sx = S->x;
        do {
#ifdef ULLong
            ys = *sx++ + carry;
            carry = ys >> 32;
            y = *bx - (ys & FFFFFFFF) - borrow;
            borrow = y >> 32 & (ULong)1;
            *bx++ = (ULong)(y & FFFFFFFF);
#else
            si = *sx++;
            ys = (si & 0xffff) + carry;
            zs = (si >> 16) + (ys >> 16);
            carry = zs >> 16;
            y = (*bx & 0xffff) - (ys & 0xffff) - borrow;
            borrow = (y & 0x10000) >> 16;
            z = (*bx >> 16) - (zs & 0xffff) - borrow;
            borrow = (z & 0x10000) >> 16;
            Storeinc(bx, z, y);
#endif
        }
        while(sx <= sxe);
        bx = b->x;
        bxe = bx + n;
        if (!*bxe) {
            while(--bxe > bx && !*bxe)
                --n;
            b->wds = n;
        }
    }
    return q;
}